

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

CppDirective cpp_directive(Env *env)

{
  State *pSVar1;
  uint32_t uVar2;
  _Bool _Var3;
  TSLexer *pTVar4;
  uint32_t rel;
  uint uVar5;
  CppDirective CVar6;
  ulong uVar7;
  ulong uVar8;
  
  pSVar1 = env->state;
  uVar5 = (pSVar1->lookahead).offset;
  if (uVar5 < (pSVar1->lookahead).size) {
    pTVar4 = (TSLexer *)((pSVar1->lookahead).contents + uVar5);
  }
  else {
    advance_before(env,0);
    pTVar4 = env->lexer;
  }
  CVar6 = CppNothing;
  if (pTVar4->lookahead == 0x23) {
    uVar2 = 1;
    do {
      rel = uVar2;
      pSVar1 = env->state;
      uVar5 = (pSVar1->lookahead).offset + rel;
      if (uVar5 < (pSVar1->lookahead).size) {
        pTVar4 = (TSLexer *)((pSVar1->lookahead).contents + uVar5);
      }
      else {
        advance_before(env,rel);
        pTVar4 = env->lexer;
      }
      uVar5 = pTVar4->lookahead;
    } while ((0xffffd01e < uVar5 - 0x3001) &&
            (uVar2 = rel + 1, ("\x01"[uVar5 - 0x20 >> 3] >> (uVar5 & 7) & 1) != 0));
    _Var3 = token_from(env,"if",rel);
    CVar6 = CppStart;
    if (!_Var3) {
      uVar8 = 0;
      do {
        uVar7 = uVar8;
        if (uVar7 == 2) goto LAB_0010a18d;
        _Var3 = token_from(env,cpp_tokens_start[uVar7 + 1],rel);
        uVar8 = uVar7 + 1;
      } while (!_Var3);
      if (1 < uVar7) {
LAB_0010a18d:
        _Var3 = token_from(env,"else",rel);
        CVar6 = CppElse;
        if (!_Var3) {
          uVar8 = 0xffffffffffffffff;
          do {
            if (uVar8 == 2) goto LAB_0010a1e1;
            _Var3 = token_from(env,cpp_tokens_else[uVar8 + 2],rel);
            uVar8 = uVar8 + 1;
          } while (!_Var3);
          if (2 < uVar8) {
LAB_0010a1e1:
            _Var3 = token_from(env,"endif",rel);
            CVar6 = CppEnd;
            if (!_Var3) {
              _Var3 = token_from(env,"define",rel);
              if (!_Var3) {
                uVar8 = 0xffffffffffffffff;
                do {
                  if (uVar8 == 5) goto LAB_0010a247;
                  _Var3 = token_from(env,cpp_tokens_other[uVar8 + 2],rel);
                  uVar8 = uVar8 + 1;
                } while (!_Var3);
                if (5 < uVar8) {
LAB_0010a247:
                  pSVar1 = env->state;
                  uVar5 = (pSVar1->lookahead).offset + rel;
                  if (uVar5 < (pSVar1->lookahead).size) {
                    pTVar4 = (TSLexer *)((pSVar1->lookahead).contents + uVar5);
                  }
                  else {
                    advance_before(env,rel);
                    pTVar4 = env->lexer;
                  }
                  if ((0xd < (uint)pTVar4->lookahead) ||
                     ((0x3400U >> (pTVar4->lookahead & 0x1fU) & 1) == 0)) {
                    _Var3 = char1(env,0x21);
                    if (!_Var3) {
                      return CppNothing;
                    }
                    if ((env->state->contexts).size != 0) {
                      return CppNothing;
                    }
                  }
                }
              }
              CVar6 = CppOther;
            }
          }
        }
      }
    }
  }
  return CVar6;
}

Assistant:

static CppDirective cpp_directive(Env *env) {
  if (!char0(env, '#')) return CppNothing;
  uint32_t start = take_space_from(env, 1);
  if (cpp_cond_start(env, start)) return CppStart;
  else if (cpp_cond_else(env, start)) return CppElse;
  else if (cpp_cond_end(env, start)) return CppEnd;
  else if (cpp_directive_other(env, start)) return CppOther;
  else return CppNothing;
}